

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analog.cxx
# Opt level: O2

void showTime(OledPixel *pixels)

{
  int iVar1;
  int iVar2;
  tm *ptVar3;
  int iVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  time_t now;
  
  (*pixels->_vptr_OledPixel[2])();
  time(&now);
  ptVar3 = localtime(&now);
  iVar4 = 0xc;
  auVar9._0_8_ = (double)(ptVar3->tm_hour % 0xc);
  auVar9._8_8_ = (double)ptVar3->tm_min;
  auVar9 = divpd(auVar9,_DAT_00108040);
  dVar6 = (double)ptVar3->tm_sec / 60.0;
  drawHand(auVar9._8_8_ / 12.0 + auVar9._0_8_,0x12,pixels);
  drawHand(dVar6 / 60.0 + auVar9._8_8_,0x1c,pixels);
  drawHand(dVar6,0x1e,pixels);
  dVar6 = 0.0;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    dVar7 = (dVar6 * 3.141592653589793) / 6.0;
    dVar8 = sin(dVar7);
    iVar1 = (*pixels->_vptr_OledPixel[8])(pixels);
    dVar7 = cos(dVar7);
    iVar2 = (*pixels->_vptr_OledPixel[9])(pixels);
    (*pixels->_vptr_OledPixel[5])
              (pixels,CONCAT44(iVar2 / 2 + (int)(dVar7 * 31.0),(int)(dVar8 * 31.0) + iVar1 / 2),
               (long)iVar2 % 2 & 0xffffffff);
    dVar6 = dVar6 + 1.0;
  }
  return;
}

Assistant:

void
showTime(
    SSD1306::OledPixel& pixels)
{
    //---------------------------------------------------------------------

    pixels.clear();

    //---------------------------------------------------------------------

    time_t now;
    time(&now);
    struct tm* tm = localtime(&now);

    //---------------------------------------------------------------------

    auto hour = (tm->tm_hour % 12) / 12.0;
    auto minute = tm->tm_min / 60.0;
    auto second = tm->tm_sec / 60.0;

    drawHand(hour + (minute / 12.0), HourHandLength, pixels);
    drawHand(minute + (second / 60.0), MinuteHandLength, pixels);
    drawHand(second, SecondHandLength, pixels);

    //---------------------------------------------------------------------

    for (auto tick = 0 ; tick < 12 ; ++tick)
    {
        auto radians = tick * M_PI / 6.0;
        pixels.setPixel(
            SSD1306::OledPoint(int(sin(radians) * TickRadius) +
                               (pixels.width() / 2),
                               int(cos(radians) * TickRadius) +
                               (pixels.height() / 2)));
    }

    //---------------------------------------------------------------------
}